

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

bool __thiscall
testing::internal::OnCallSpec<int_(int,_int)>::Matches
          (OnCallSpec<int_(int,_int)> *this,ArgumentTuple *args)

{
  bool bVar1;
  bool local_19;
  ArgumentTuple *args_local;
  OnCallSpec<int_(int,_int)> *this_local;
  
  bVar1 = TupleMatches<std::tuple<testing::Matcher<int>,testing::Matcher<int>>,std::tuple<int,int>>
                    ((tuple<testing::Matcher<int>,_testing::Matcher<int>_> *)(this + 0x10),args);
  local_19 = false;
  if (bVar1) {
    local_19 = MatcherBase<const_std::tuple<int,_int>_&>::Matches
                         ((MatcherBase<const_std::tuple<int,_int>_&> *)(this + 0x40),args);
  }
  return local_19;
}

Assistant:

bool Matches(const ArgumentTuple& args) const {
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }